

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O1

UBool __thiscall icu_63::UnifiedCache::_inProgress(UnifiedCache *this,UHashElement *element)

{
  u_atomic_int32_t *puVar1;
  int iVar2;
  int iVar3;
  SharedObject *pSVar4;
  SharedObject *pSVar5;
  
  pSVar4 = (SharedObject *)(element->value).pointer;
  iVar3 = *(int *)((long)(element->key).pointer + 8);
  if (pSVar4 != (SharedObject *)0x0) {
    LOCK();
    puVar1 = &pSVar4->hardRefCount;
    iVar2 = (puVar1->super___atomic_base<int>)._M_i;
    (puVar1->super___atomic_base<int>)._M_i = (puVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    if (iVar2 == 0) {
      this->fNumValuesInUse = this->fNumValuesInUse + 1;
    }
  }
  pSVar5 = this->fNoValue;
  if (pSVar4 != (SharedObject *)0x0) {
    LOCK();
    puVar1 = &pSVar4->hardRefCount;
    (puVar1->super___atomic_base<int>)._M_i = (puVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if ((puVar1->super___atomic_base<int>)._M_i == 0) {
      this->fNumValuesInUse = this->fNumValuesInUse + -1;
    }
  }
  return pSVar5 == pSVar4 && iVar3 == 0;
}

Assistant:

void UnifiedCache::_fetch(
        const UHashElement *element,
        const SharedObject *&value,
        UErrorCode &status) const {
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    status = theKey->fCreationStatus;

    // Since we have the cache lock, calling regular SharedObject add/removeRef
    // could cause us to deadlock on ourselves since they may need to lock
    // the cache mutex.
    removeHardRef(value);
    value = static_cast<const SharedObject *>(element->value.pointer);
    addHardRef(value);
}